

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTessellationGeometryInteractionTests.cpp
# Opt level: O0

string * __thiscall
deqp::gles31::Functional::(anonymous_namespace)::FeedbackPrimitiveTypeCase::
getTessellationControlSource_abi_cxx11_(string *__return_storage_ptr__,void *this)

{
  RenderContext *pRVar1;
  ContextType local_1c4;
  string local_1c0;
  undefined1 local_190 [8];
  ostringstream buf;
  FeedbackPrimitiveTypeCase *this_local;
  
  buf._368_8_ = this;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_190);
  std::operator<<((ostream *)local_190,
                  "${VERSION_DECL}\n${EXTENSION_TESSELATION_SHADER}layout(vertices = 9) out;\n\nuniform highp float u_innerTessellationLevel;\nuniform highp float u_outerTessellationLevel;\n\nvoid main (void)\n{\n\tif (gl_PatchVerticesIn != 4)\n\t\treturn;\n\n\t// Convert input 2x2 grid to 3x3 grid\n\tfloat xweight = float(gl_InvocationID % 3) / 2.0f;\n\tfloat yweight = float(gl_InvocationID / 3) / 2.0f;\n\n\tvec4 y0 = mix(gl_in[0].gl_Position, gl_in[1].gl_Position, yweight);\n\tvec4 y1 = mix(gl_in[2].gl_Position, gl_in[3].gl_Position, yweight);\n\n\tgl_out[gl_InvocationID].gl_Position = mix(y0, y1, xweight);\n\n"
                 );
  if (*(int *)((long)this + 0x78) == 0) {
    std::operator<<((ostream *)local_190,
                    "\tgl_TessLevelOuter[0] = 3.0;\n\tgl_TessLevelOuter[1] = 3.0;\n\tgl_TessLevelOuter[2] = 3.0;\n\tgl_TessLevelInner[0] = 3.0;\n"
                   );
  }
  else if (*(int *)((long)this + 0x78) == 1) {
    std::operator<<((ostream *)local_190,
                    "\tgl_TessLevelOuter[0] = 3.0;\n\tgl_TessLevelOuter[1] = 3.0;\n\tgl_TessLevelOuter[2] = 3.0;\n\tgl_TessLevelOuter[3] = 3.0;\n\tgl_TessLevelInner[0] = 3.0;\n\tgl_TessLevelInner[1] = 3.0;\n"
                   );
  }
  else if (*(int *)((long)this + 0x78) == 2) {
    std::operator<<((ostream *)local_190,
                    "\tgl_TessLevelOuter[0] = 3.0;\n\tgl_TessLevelOuter[1] = 3.0;\n");
  }
  std::operator<<((ostream *)local_190,"}\n");
  std::__cxx11::ostringstream::str();
  pRVar1 = gles31::Context::getRenderContext(*(Context **)((long)this + 0x70));
  local_1c4.super_ApiType.m_bits = (ApiType)(*pRVar1->_vptr_RenderContext[2])();
  anon_unknown_1::specializeShader(__return_storage_ptr__,&local_1c0,&local_1c4);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_190);
  return __return_storage_ptr__;
}

Assistant:

std::string FeedbackPrimitiveTypeCase::getTessellationControlSource (void) const
{
	std::ostringstream buf;

	buf <<	"${VERSION_DECL}\n"
			"${EXTENSION_TESSELATION_SHADER}"
			"layout(vertices = 9) out;\n"
			"\n"
			"uniform highp float u_innerTessellationLevel;\n"
			"uniform highp float u_outerTessellationLevel;\n"
			"\n"
			"void main (void)\n"
			"{\n"
			"	if (gl_PatchVerticesIn != 4)\n"
			"		return;\n"
			"\n"
			"	// Convert input 2x2 grid to 3x3 grid\n"
			"	float xweight = float(gl_InvocationID % 3) / 2.0f;\n"
			"	float yweight = float(gl_InvocationID / 3) / 2.0f;\n"
			"\n"
			"	vec4 y0 = mix(gl_in[0].gl_Position, gl_in[1].gl_Position, yweight);\n"
			"	vec4 y1 = mix(gl_in[2].gl_Position, gl_in[3].gl_Position, yweight);\n"
			"\n"
			"	gl_out[gl_InvocationID].gl_Position = mix(y0, y1, xweight);\n"
			"\n";

	if (m_tessellationOutput == TESSELLATION_OUT_TRIANGLES)
		buf <<	"	gl_TessLevelOuter[0] = 3.0;\n"
				"	gl_TessLevelOuter[1] = 3.0;\n"
				"	gl_TessLevelOuter[2] = 3.0;\n"
				"	gl_TessLevelInner[0] = 3.0;\n";
	else if (m_tessellationOutput == TESSELLATION_OUT_QUADS)
		buf <<	"	gl_TessLevelOuter[0] = 3.0;\n"
				"	gl_TessLevelOuter[1] = 3.0;\n"
				"	gl_TessLevelOuter[2] = 3.0;\n"
				"	gl_TessLevelOuter[3] = 3.0;\n"
				"	gl_TessLevelInner[0] = 3.0;\n"
				"	gl_TessLevelInner[1] = 3.0;\n";
	else if (m_tessellationOutput == TESSELLATION_OUT_ISOLINES)
		buf <<	"	gl_TessLevelOuter[0] = 3.0;\n"
				"	gl_TessLevelOuter[1] = 3.0;\n";
	else
		DE_ASSERT(false);

	buf <<	"}\n";

	return specializeShader(buf.str(), m_context.getRenderContext().getType());
}